

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCGeometryCollider.cpp
# Opt level: O3

int chrono::collision::ChGeometryCollider::ComputeSphereSphereCollisions
              (ChSphere *mgeo1,Vector *c1,ChSphere *mgeo2,Vector *c2,
              ChNarrowPhaseCollider *mcollider,bool just_intersection)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  undefined7 in_register_00000089;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  ChVector<double> result_1;
  ChVector<double> result;
  ChCollisionPair temp;
  ChVector<float> local_b4;
  ChVector<double> local_a8;
  ChVector<double> local_90;
  undefined1 local_78 [44];
  undefined4 uStack_4c;
  undefined1 auStack_48 [28];
  
  dVar1 = mgeo1->rad;
  dVar3 = c2->m_data[1] - c1->m_data[1];
  dVar4 = c2->m_data[0] - c1->m_data[0];
  dVar5 = c2->m_data[2] - c1->m_data[2];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar3 * dVar3;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar4;
  auVar8 = vfmadd231sd_fma(auVar8,auVar9,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar5;
  auVar8 = vfmadd231sd_fma(auVar8,auVar10,auVar10);
  auVar8 = vsqrtsd_avx(auVar8,auVar8);
  dVar11 = auVar8._0_8_;
  dVar2 = mgeo2->rad;
  bVar6 = 2.2250738585072014e-308 <= dVar11;
  if ((int)CONCAT71(in_register_00000089,just_intersection) == 0) {
    if (dVar1 + dVar2 + 0.0022 <= dVar11) {
      return 0;
    }
    dVar11 = 1.0 / dVar11;
    dVar7 = (double)((ulong)bVar6 * (long)(dVar11 * dVar4) + (ulong)!bVar6 * 0x3ff0000000000000);
    dVar3 = (double)((ulong)bVar6 * (long)(dVar3 * dVar11));
    dVar4 = (double)((ulong)bVar6 * (long)(dVar5 * dVar11));
    local_90.m_data[0] = dVar7 * dVar1 + c1->m_data[0];
    local_90.m_data[1] = dVar1 * dVar3 + c1->m_data[1];
    local_90.m_data[2] = dVar4 * dVar1 + c1->m_data[2];
    local_a8.m_data[0] = c2->m_data[0] - dVar7 * dVar2;
    local_a8.m_data[1] = c2->m_data[1] - dVar3 * dVar2;
    local_a8.m_data[2] = c2->m_data[2] - dVar4 * dVar2;
    local_b4.m_data[0] = (float)dVar7;
    local_b4.m_data[1] = (float)dVar3;
    local_b4.m_data[2] = (float)dVar4;
    auStack_48 = SUB3228(ZEXT832(0),0);
    local_78._16_28_ = auStack_48 << 0x20;
    uStack_4c = 0;
    ChCollisionPair::Set
              ((ChCollisionPair *)local_78,&mgeo1->super_ChGeometry,&mgeo2->super_ChGeometry,
               &local_90,&local_a8,&local_b4,(float *)0x0);
  }
  else {
    if (dVar1 + dVar2 <= dVar11) {
      return 0;
    }
    ChCollisionPair::ChCollisionPair
              ((ChCollisionPair *)local_78,&mgeo1->super_ChGeometry,&mgeo2->super_ChGeometry);
  }
  ChNarrowPhaseCollider::AddCollisionPair(mcollider,(ChCollisionPair *)local_78);
  return 1;
}

Assistant:

int ChGeometryCollider::ComputeSphereSphereCollisions(
    geometry::ChSphere& mgeo1,         ///< first sphere
    Vector* c1,                        ///< absolute position of 1st
    geometry::ChSphere& mgeo2,         ///< second sphere
    Vector* c2,                        ///< absolute position of 2nd
    ChNarrowPhaseCollider& mcollider,  ///< reference to a collider to store contacts into
    bool just_intersection) {
    Vector relPos = Vsub(*c2, *c1);
    Vector dir = Vnorm(relPos);
    double dist = Vlength(relPos);
    if (just_intersection) {
        if (dist < (mgeo1.rad + mgeo2.rad)) {
            ChCollisionPair temp = ChCollisionPair(&mgeo1, &mgeo2);
            mcollider.AddCollisionPair(&temp);
            return 1;
        }
    } else {
        if (dist < CH_COLL_ENVELOPE + (mgeo1.rad + mgeo2.rad)) {
            ChCollisionPair temp = ChCollisionPair(&mgeo1, &mgeo2,                    // geometries
                                                   Vadd(*c1, Vmul(dir, mgeo1.rad)),   // p1
                                                   Vadd(*c2, Vmul(dir, -mgeo2.rad)),  // p2
                                                   dir);                              // normal
            mcollider.AddCollisionPair(&temp);
            return 1;
        }
    }

    return 0;
}